

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

CURLcode http2_data_setup(Curl_cfilter *cf,Curl_easy *data,stream_ctx **pstream)

{
  void *pvVar1;
  stream_ctx *psVar2;
  stream_ctx *local_40;
  stream_ctx *stream;
  cf_h2_ctx *ctx;
  stream_ctx **pstream_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  pvVar1 = cf->ctx;
  if ((data->req).p.file == (FILEPROTO *)0x0) {
    Curl_failf(data,"initialization failure, transfer not http initialized");
    cf_local._4_4_ = CURLE_FAILED_INIT;
  }
  else {
    if ((data == (Curl_easy *)0x0) || ((data->req).p.file == (FILEPROTO *)0x0)) {
      local_40 = (stream_ctx *)0x0;
    }
    else {
      local_40 = (stream_ctx *)((data->req).p.http)->h2_ctx;
    }
    if (local_40 == (stream_ctx *)0x0) {
      psVar2 = (stream_ctx *)(*Curl_ccalloc)(1,0x158);
      if (psVar2 == (stream_ctx *)0x0) {
        cf_local._4_4_ = CURLE_OUT_OF_MEMORY;
      }
      else {
        psVar2->id = -1;
        Curl_bufq_initp(&psVar2->sendbuf,(bufc_pool *)((long)pvVar1 + 0x98),4,0);
        Curl_bufq_initp(&psVar2->recvbuf,(bufc_pool *)((long)pvVar1 + 0x98),0x280,1);
        Curl_h1_req_parse_init(&psVar2->h1,0x100000);
        Curl_dynhds_init(&psVar2->resp_trailers,0,0x100000);
        psVar2->resp_hds_len = 0;
        psVar2->bodystarted = false;
        psVar2->status_code = -1;
        psVar2->closed = false;
        psVar2->close_handled = false;
        psVar2->error = 0;
        psVar2->local_window_size = 0xa00000;
        psVar2->upload_left = 0;
        (((data->req).p.rtsp)->http_wrapper).h2_ctx = psVar2;
        *pstream = psVar2;
        cf_local._4_4_ = CURLE_OK;
      }
    }
    else {
      *pstream = local_40;
      cf_local._4_4_ = CURLE_OK;
    }
  }
  return cf_local._4_4_;
}

Assistant:

static CURLcode http2_data_setup(struct Curl_cfilter *cf,
                                 struct Curl_easy *data,
                                 struct stream_ctx **pstream)
{
  struct cf_h2_ctx *ctx = cf->ctx;
  struct stream_ctx *stream;

  (void)cf;
  DEBUGASSERT(data);
  if(!data->req.p.http) {
    failf(data, "initialization failure, transfer not http initialized");
    return CURLE_FAILED_INIT;
  }
  stream = H2_STREAM_CTX(data);
  if(stream) {
    *pstream = stream;
    return CURLE_OK;
  }

  stream = calloc(1, sizeof(*stream));
  if(!stream)
    return CURLE_OUT_OF_MEMORY;

  stream->id = -1;
  Curl_bufq_initp(&stream->sendbuf, &ctx->stream_bufcp,
                  H2_STREAM_SEND_CHUNKS, BUFQ_OPT_NONE);
  Curl_bufq_initp(&stream->recvbuf, &ctx->stream_bufcp,
                  H2_STREAM_RECV_CHUNKS, BUFQ_OPT_SOFT_LIMIT);
  Curl_h1_req_parse_init(&stream->h1, H1_PARSE_DEFAULT_MAX_LINE_LEN);
  Curl_dynhds_init(&stream->resp_trailers, 0, DYN_HTTP_REQUEST);
  stream->resp_hds_len = 0;
  stream->bodystarted = FALSE;
  stream->status_code = -1;
  stream->closed = FALSE;
  stream->close_handled = FALSE;
  stream->error = NGHTTP2_NO_ERROR;
  stream->local_window_size = H2_STREAM_WINDOW_SIZE;
  stream->upload_left = 0;

  H2_STREAM_LCTX(data) = stream;
  *pstream = stream;
  return CURLE_OK;
}